

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::escaped(sequence *__return_storage_ptr__,spec *s)

{
  sequence *psVar1;
  initializer_list<unsigned_char> cs;
  character_either escape_char;
  either escape_seq;
  repeat_exact local_190;
  sequence local_178;
  undefined1 local_158 [8];
  pointer local_150;
  iterator local_148;
  uchar *local_140;
  hexdig local_138;
  repeat_exact local_110;
  sequence *local_f8;
  hexdig local_f0;
  character local_c8;
  character local_b8;
  sequence local_a8;
  either local_88;
  digit local_68;
  character_in_range local_50;
  character_in_range local_40;
  
  local_138.super_scanner_base._vptr_scanner_base._0_7_ = 0x74726e66625c22;
  cs._M_len = 7;
  cs._M_array = (iterator)&local_138;
  character_either::character_either((character_either *)local_158,cs);
  if (s->v1_1_0_add_escape_sequence_e == true) {
    local_138.super_scanner_base._vptr_scanner_base._0_1_ = 0x65;
    if (local_148._M_current == local_140) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_150,local_148,
                 (uchar *)&local_138);
    }
    else {
      *local_148._M_current = 'e';
      local_148._M_current = local_148._M_current + 1;
    }
  }
  local_b8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555890;
  local_b8.value_ = 'u';
  local_138.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_00556728;
  local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00556780;
  local_f0.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_00555950;
  local_f0.scanner_.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x3930;
  local_178.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
  local_178.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_178.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_6_,0x6661);
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
  local_68.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x4641;
  local_f8 = __return_storage_ptr__;
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_138.scanner_,(digit *)&local_f0,(character_in_range *)&local_178,
             (character_in_range *)&local_68);
  local_110.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ab0;
  local_110.length_ = 4;
  scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
            (&local_110.other_,&local_138);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            (&local_a8,&local_b8,&local_110);
  local_c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555890;
  local_c8.value_ = 'U';
  local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_00556728;
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00556780;
  local_68.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_00555950;
  local_68.scanner_.from_ = '0';
  local_68.scanner_.to_ = '9';
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
  local_40.from_ = 'a';
  local_40.to_ = 'f';
  local_50.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
  local_50.from_ = 'A';
  local_50.to_ = 'F';
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_f0.scanner_,&local_68,&local_40,&local_50);
  local_190.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ab0;
  local_190.length_ = 8;
  scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
            (&local_190.other_,&local_f0);
  sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
            (&local_178,&local_c8,&local_190);
  either::either<toml::detail::character_either,toml::detail::sequence,toml::detail::sequence>
            (&local_88,(character_either *)local_158,&local_a8,&local_178);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_178.others_);
  if (local_190.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_190.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_190.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f0.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_a8.others_);
  if (local_110.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_110.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  local_110.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_138.scanner_.others_);
  if (s->v1_1_0_add_escape_sequence_x == true) {
    local_190.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555890;
    local_190.length_ = CONCAT71(local_190.length_._1_7_,0x78);
    local_138.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_00556728;
    local_a8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00556780;
    local_a8.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__scanner_base_00555950;
    local_a8.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0x3930;
    local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
    local_68.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x6661;
    local_110.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555950;
    local_110.length_ = CONCAT62(local_110.length_._2_6_,0x4641);
    either::
    either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
              (&local_138.scanner_,(digit *)&local_a8,(character_in_range *)&local_68,
               (character_in_range *)&local_110);
    local_178.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_exact_00555ab0;
    local_178.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
    scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
              ((scanner_storage *)
               &local_178.others_.
                super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ._M_impl.super__Vector_impl_data._M_finish,&local_138);
    sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
              ((sequence *)&local_f0,(character *)&local_190,(repeat_exact *)&local_178);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    emplace_back<toml::detail::sequence>(&local_88.others_,(sequence *)&local_f0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&local_f0.scanner_);
    if (local_178.others_.
        super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      (**(code **)((long)((local_178.others_.
                           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
    }
    local_178.others_.
    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_138.scanner_.others_);
  }
  psVar1 = local_f8;
  local_138.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00555890;
  local_138.scanner_.super_scanner_base._vptr_scanner_base._0_1_ = 0x5c;
  sequence::sequence<toml::detail::character,toml::detail::either>
            (local_f8,(character *)&local_138,&local_88);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_88.others_);
  if (local_150 != (pointer)0x0) {
    operator_delete(local_150,(long)local_140 - (long)local_150);
  }
  return psVar1;
}

Assistant:

TOML11_INLINE sequence escaped(const spec& s)
{
    character_either escape_char{
        '\"','\\', 'b', 'f', 'n', 'r', 't'
    };
    if(s.v1_1_0_add_escape_sequence_e)
    {
        escape_char.push_back(char_type('e'));
    }

    either escape_seq(
            std::move(escape_char),
            sequence(character('u'), repeat_exact(4, hexdig(s))),
            sequence(character('U'), repeat_exact(8, hexdig(s)))
        );

    if(s.v1_1_0_add_escape_sequence_x)
    {
        escape_seq.push_back(
            sequence(character('x'), repeat_exact(2, hexdig(s)))
        );
    }

    return sequence(
            character('\\'),
            std::move(escape_seq)
        );
}